

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

wostream * mjs::operator<<(wostream *os,token_type t)

{
  char *pcVar1;
  wostream *pwVar2;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream oss;
  token_type t_local;
  wostream *os_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  operator<<((ostream *)local_190,t);
  std::__cxx11::ostringstream::str();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pwVar2 = std::operator<<(os,pcVar1);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return pwVar2;
}

Assistant:

std::wostream& operator<<(std::wostream& os, token_type t) {
    std::ostringstream oss;
    oss << t;
    return os << oss.str().c_str();
}